

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void pstack::
     print_container<std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,pstack::Elf::Object_const*const&>
               (ostream *os,vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_> *container,Object **ctx)

{
  bool bVar1;
  ostream *os_00;
  JSON<Elf64_Phdr,_const_pstack::Elf::Object_*> local_60;
  Elf64_Phdr *local_50;
  Elf64_Phdr *field;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_> *__range2;
  char *sep;
  Object **ctx_local;
  vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_> *container_local;
  ostream *os_local;
  
  std::operator<<(os,"[ ");
  __range2 = (vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_> *)0x2a9a45;
  __end0 = std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::begin(container);
  field = (Elf64_Phdr *)std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                      (&__end0,(__normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
                                *)&field);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
               ::operator*(&__end0);
    os_00 = std::operator<<(os,(char *)__range2);
    local_60 = json<Elf64_Phdr,pstack::Elf::Object_const*>(local_50,ctx);
    operator<<(os_00,&local_60);
    __range2 = (vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_> *)anon_var_dwarf_c456f;
    __gnu_cxx::
    __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>::
    operator++(&__end0);
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}